

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O2

int __thiscall
FileHandlePool::getAvailableResource
          (FileHandlePool *this,fdb_file_handle **dbfile,fdb_kvs_handle **db)

{
  value_type pPVar1;
  bool bVar2;
  int iVar3;
  reference ppPVar4;
  bool inverse;
  fdb_kvs_handle **local_38;
  
  local_38 = db;
  do {
    do {
      iVar3 = rand();
      inverse = true;
      ppPVar4 = std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::at
                          (&this->pool_vector,
                           (long)(int)((ulong)(long)iVar3 %
                                      (ulong)((long)(this->pool_vector).
                                                                                                        
                                                  super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this->pool_vector).
                                                                                                        
                                                  super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3)));
      pPVar1 = *ppPVar4;
    } while (pPVar1 == (value_type)0x0);
    bVar2 = std::atomic<bool>::compare_exchange_strong
                      (&pPVar1->available,&inverse,false,memory_order_seq_cst);
  } while (!bVar2);
  *dbfile = pPVar1->dbfile;
  *local_38 = pPVar1->db;
  return pPVar1->index;
}

Assistant:

int getAvailableResource(fdb_file_handle **dbfile, fdb_kvs_handle **db) {
        while (true) {
            int index = rand() % pool_vector.size();
            bool inverse = true;
            PoolEntry *pe = pool_vector.at(index);
            if (pe && pe->available.compare_exchange_strong(inverse, false)) {
                *dbfile = pe->dbfile;
                *db = pe->db;
                return pe->index;
            }
        }
    }